

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

aspa_status
aspa_table_src_replace
          (aspa_table *dst,aspa_table *src,rtr_socket *rtr_socket,_Bool notify_dst,_Bool notify_src)

{
  pthread_rwlock_t *__rwlock;
  pthread_rwlock_t *__rwlock_00;
  long lVar1;
  aspa_array *aspa_array;
  aspa_store_node *paVar2;
  aspa_status aVar3;
  aspa_store_node **node;
  aspa_store_node **ppaVar4;
  aspa_record *paVar5;
  aspa_array *array;
  size_t i;
  ulong uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  aVar3 = ASPA_ERROR;
  if ((((src == dst) || (dst == (aspa_table *)0x0)) || (src == (aspa_table *)0x0)) ||
     (rtr_socket == (rtr_socket *)0x0)) goto LAB_0010cac2;
  __rwlock = &dst->update_lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock);
  __rwlock_00 = &src->update_lock;
  pthread_rwlock_wrlock((pthread_rwlock_t *)__rwlock_00);
  pthread_rwlock_wrlock((pthread_rwlock_t *)dst);
  pthread_rwlock_wrlock((pthread_rwlock_t *)src);
  node = aspa_store_get_node(&src->store,rtr_socket);
  if (((node == (aspa_store_node **)0x0) || (*node == (aspa_store_node *)0x0)) ||
     (aspa_array = (*node)->aspa_array, aspa_array == (aspa_array *)0x0)) {
LAB_0010ca9b:
    pthread_rwlock_unlock((pthread_rwlock_t *)src);
    pthread_rwlock_unlock((pthread_rwlock_t *)dst);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock_00);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    aVar3 = ASPA_ERROR;
  }
  else {
    ppaVar4 = aspa_store_get_node(&dst->store,rtr_socket);
    if ((ppaVar4 == (aspa_store_node **)0x0) ||
       (paVar2 = *ppaVar4, paVar2 == (aspa_store_node *)0x0)) {
      array = (aspa_array *)0x0;
      aVar3 = aspa_store_create_node(&dst->store,rtr_socket,aspa_array,(aspa_store_node ***)0x0);
      if (aVar3 != ASPA_SUCCESS) goto LAB_0010ca9b;
    }
    else {
      array = paVar2->aspa_array;
      paVar2->aspa_array = aspa_array;
    }
    aspa_store_remove_node(node);
    pthread_rwlock_unlock((pthread_rwlock_t *)src);
    pthread_rwlock_unlock((pthread_rwlock_t *)dst);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock_00);
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    if (notify_src) {
      for (uVar6 = 0; uVar6 < aspa_array->size; uVar6 = uVar6 + 1) {
        paVar5 = aspa_array_get_record(aspa_array,uVar6);
        aspa_table_notify_clients(src,paVar5,rtr_socket,ASPA_REMOVE);
      }
    }
    if (array != (aspa_array *)0x0) {
      if (notify_dst) {
        for (uVar6 = 0; uVar6 < array->size; uVar6 = uVar6 + 1) {
          paVar5 = aspa_array_get_record(array,uVar6);
          aspa_table_notify_clients(dst,paVar5,rtr_socket,ASPA_REMOVE);
        }
      }
      aspa_array_free(array,true);
    }
    aVar3 = ASPA_SUCCESS;
    if (notify_dst) {
      for (uVar6 = 0; uVar6 < aspa_array->size; uVar6 = uVar6 + 1) {
        paVar5 = aspa_array_get_record(aspa_array,uVar6);
        aspa_table_notify_clients(dst,paVar5,rtr_socket,ASPA_ADD);
      }
      aVar3 = ASPA_SUCCESS;
    }
  }
LAB_0010cac2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar3;
  }
  __stack_chk_fail();
}

Assistant:

enum aspa_status aspa_table_src_replace(struct aspa_table *dst, struct aspa_table *src, struct rtr_socket *rtr_socket,
					bool notify_dst, bool notify_src)
{
	if (!dst || !src || !rtr_socket || src == dst)
		return ASPA_ERROR;

	pthread_rwlock_wrlock(&dst->update_lock);
	pthread_rwlock_wrlock(&src->update_lock);
	pthread_rwlock_wrlock(&dst->lock);
	pthread_rwlock_wrlock(&src->lock);

	struct aspa_store_node **src_node = aspa_store_get_node(&src->store, rtr_socket);

	if (!src_node || !*src_node || !(*src_node)->aspa_array) {
		pthread_rwlock_unlock(&src->lock);
		pthread_rwlock_unlock(&dst->lock);
		pthread_rwlock_unlock(&src->update_lock);
		pthread_rwlock_unlock(&dst->update_lock);
		return ASPA_ERROR;
	}

	struct aspa_array *new_array = (*src_node)->aspa_array;
	struct aspa_array *old_array = NULL;

	// Try to get an existing node in the source table's store
	struct aspa_store_node **existing_dst_node = aspa_store_get_node(&dst->store, rtr_socket);

	if (existing_dst_node && *existing_dst_node) {
		// Swap array
		old_array = (*existing_dst_node)->aspa_array;
		(*existing_dst_node)->aspa_array = new_array;
	} else {
		// There's no old_array.
		// Destination table hasn't got an existing store node for the socket, so create a new one
		if (aspa_store_create_node(&dst->store, rtr_socket, new_array, NULL) != ASPA_SUCCESS) {
			pthread_rwlock_unlock(&src->lock);
			pthread_rwlock_unlock(&dst->lock);
			pthread_rwlock_unlock(&src->update_lock);
			pthread_rwlock_unlock(&dst->update_lock);
			return ASPA_ERROR;
		}
	}

	// Remove socket from source table's store
	aspa_store_remove_node(src_node);
	pthread_rwlock_unlock(&src->lock);
	pthread_rwlock_unlock(&dst->lock);
	pthread_rwlock_unlock(&src->update_lock);
	pthread_rwlock_unlock(&dst->update_lock);

	if (notify_src)
		// Notify src clients their records are being removed
		for (size_t i = 0; i < new_array->size; i++)
			aspa_table_notify_clients(src, aspa_array_get_record(new_array, i), rtr_socket, ASPA_REMOVE);

	if (old_array) {
		if (notify_dst)
			// Notify dst clients of their existing records are being removed
			for (size_t i = 0; i < old_array->size; i++)
				aspa_table_notify_clients(dst, aspa_array_get_record(old_array, i), rtr_socket,
							  ASPA_REMOVE);

		// Free the old array and their provider sets
		aspa_array_free(old_array, true);
	}

	if (notify_dst)
		// Notify dst clients the records from src are added
		for (size_t i = 0; i < new_array->size; i++)
			aspa_table_notify_clients(dst, aspa_array_get_record(new_array, i), rtr_socket, ASPA_ADD);

	return ASPA_SUCCESS;
}